

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

QString * __thiscall QProgressBar::text(QString *__return_storage_ptr__,QProgressBar *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QLocale locale;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QWidget).field_0x8;
  iVar1 = *(int *)(lVar4 + 600);
  iVar2 = *(int *)(lVar4 + 0x254);
  if (((iVar1 == 0 && iVar2 == 0) || (*(int *)(lVar4 + 0x25c) < iVar2)) ||
     (iVar2 == -0x80000000 && *(int *)(lVar4 + 0x25c) == -0x80000000)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
LAB_0043073c:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar4 + 0x278));
    locale = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
    QLocale::QLocale(&locale,(QLocale *)(lVar4 + 0x210));
    uVar5 = QLocale::numberOptions();
    QLocale::setNumberOptions(&locale,uVar5 | 1);
    QLocale::toString((longlong)&local_58);
    QString::replace((QLatin1String *)__return_storage_ptr__,(QString *)0x2,0x6612be);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QLocale::toString((QString *)&local_58,&locale,*(int *)(lVar4 + 0x25c));
    QString::replace((QLatin1String *)__return_storage_ptr__,(QString *)0x2,0x6612bb);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (iVar1 == iVar2) {
      QLocale::toString((longlong)&local_58);
    }
    else {
      QLocale::toString((QString *)&local_58,&locale,
                        (int)(((double)((long)*(int *)(lVar4 + 0x25c) -
                                       (long)*(int *)(lVar4 + 0x254)) * 100.0) /
                             (double)((long)iVar1 - (long)iVar2)));
    }
    QString::replace((QLatin1String *)__return_storage_ptr__,(QString *)0x2,0x6797f6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QLocale::~QLocale(&locale);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) goto LAB_0043073c;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QProgressBar::text() const
{
    Q_D(const QProgressBar);
    if ((d->maximum == 0 && d->minimum == 0) || d->value < d->minimum
            || (d->value == INT_MIN && d->minimum == INT_MIN))
        return QString();

    qint64 totalSteps = qint64(d->maximum) - d->minimum;

    QString result = d->format;
    QLocale locale = d->locale; // Omit group separators for compatibility with previous versions that were non-localized.
    locale.setNumberOptions(locale.numberOptions() | QLocale::OmitGroupSeparator);
    result.replace("%m"_L1, locale.toString(totalSteps));
    result.replace("%v"_L1, locale.toString(d->value));

    // If max and min are equal and we get this far, it means that the
    // progress bar has one step and that we are on that step. Return
    // 100% here in order to avoid division by zero further down.
    if (totalSteps == 0) {
        result.replace("%p"_L1, locale.toString(100));
        return result;
    }

    const auto progress = static_cast<int>((qint64(d->value) - d->minimum) * 100.0 / totalSteps);
    result.replace("%p"_L1, locale.toString(progress));
    return result;
}